

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_mdtm_resp(Curl_easy *data,int ftpcode)

{
  undefined1 *puVar1;
  uchar uVar2;
  FILEPROTO *pFVar3;
  connectdata *pcVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  int iVar9;
  CURLcode CVar10;
  time_t tVar11;
  CURLcode CVar12;
  char *pcVar13;
  int second;
  int minute;
  int hour;
  int day;
  int month;
  int year;
  tm buffer;
  char timebuf [24];
  
  pFVar3 = (data->req).p.file;
  if (ftpcode == 0x226) {
    pcVar13 = "MDTM failed: file does not exist or permission problem, continuing";
LAB_005c7c6b:
    CVar10 = CURLE_OK;
    Curl_infof(data,pcVar13);
  }
  else {
    if (ftpcode != 0xd5) {
      pcVar13 = "unsupported MDTM reply format";
      goto LAB_005c7c6b;
    }
    pcVar4 = data->conn;
    CVar12 = CURLE_OK;
    iVar9 = __isoc99_sscanf((data->state).buffer + 4,"%04d%02d%02d%02d%02d%02d",&year,&month,&day,
                            &hour,&minute,&second);
    if (iVar9 == 6) {
      curl_msnprintf(timebuf,0x18,"%04d%02d%02d %02d:%02d:%02d GMT",(ulong)(uint)year,
                     (ulong)(uint)month,(ulong)(uint)day,(ulong)(uint)hour,(ulong)(uint)minute,
                     (ulong)(uint)second);
      tVar11 = Curl_getdate_capped(timebuf);
      (data->info).filetime = tVar11;
    }
    uVar5 = *(ulong *)&(data->set).field_0x8e2;
    bVar8 = true;
    CVar10 = CURLE_OK;
    if ((((((uint)uVar5 >> 0x19 & 1) != 0) && (CVar10 = CVar12, (uVar5 & 0x20) != 0)) &&
        ((pcVar4->proto).ftpc.file != (char *)0x0)) && (lVar6 = (data->info).filetime, -1 < lVar6))
    {
      CVar10 = Curl_gmtime(lVar6,&buffer);
      if (CVar10 == CURLE_OK) {
        iVar9 = 6;
        if (buffer.tm_wday != 0) {
          iVar9 = buffer.tm_wday + -1;
        }
        bVar8 = false;
        iVar9 = curl_msnprintf(timebuf,0x80,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                               Curl_wkday[iVar9],(ulong)(uint)buffer.tm_mday,
                               Curl_month[buffer.tm_mon],(ulong)(buffer.tm_year + 0x76c),
                               (ulong)(uint)buffer.tm_hour,(ulong)(uint)buffer.tm_min,
                               (ulong)(uint)buffer.tm_sec);
        CVar10 = Curl_client_write(data,3,timebuf,(long)iVar9);
        if (CVar10 == CURLE_OK) {
          bVar8 = true;
          CVar10 = CURLE_OK;
        }
      }
      else {
        bVar8 = false;
      }
    }
    if (!bVar8) {
      return CVar10;
    }
  }
  uVar2 = (data->set).timecondition;
  if (uVar2 != '\0') {
    lVar6 = (data->info).filetime;
    if ((lVar6 < 1) || (lVar7 = (data->set).timevalue, lVar7 < 1)) {
      Curl_infof(data,"Skipping time comparison");
    }
    else if (uVar2 == '\x02') {
      if (lVar7 < lVar6) {
        pcVar13 = "The requested document is not old enough";
LAB_005c7d13:
        Curl_infof(data,pcVar13);
        pFVar3->fd = 2;
        puVar1 = &(data->info).field_0xec;
        *puVar1 = *puVar1 | 1;
        (data->conn->proto).ftpc.state = FTP_STOP;
        return CURLE_OK;
      }
    }
    else if (lVar6 <= lVar7) {
      pcVar13 = "The requested document is not new enough";
      goto LAB_005c7d13;
    }
  }
  if (CVar10 == CURLE_OK) {
    CVar10 = ftp_state_type(data);
  }
  return CVar10;
}

Assistant:

static CURLcode ftp_state_mdtm_resp(struct Curl_easy *data,
                                    int ftpcode)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  switch(ftpcode) {
  case 213:
    {
      /* we got a time. Format should be: "YYYYMMDDHHMMSS[.sss]" where the
         last .sss part is optional and means fractions of a second */
      int year, month, day, hour, minute, second;
      if(6 == sscanf(&data->state.buffer[4], "%04d%02d%02d%02d%02d%02d",
                     &year, &month, &day, &hour, &minute, &second)) {
        /* we have a time, reformat it */
        char timebuf[24];
        msnprintf(timebuf, sizeof(timebuf),
                  "%04d%02d%02d %02d:%02d:%02d GMT",
                  year, month, day, hour, minute, second);
        /* now, convert this into a time() value: */
        data->info.filetime = Curl_getdate_capped(timebuf);
      }

#ifdef CURL_FTP_HTTPSTYLE_HEAD
      /* If we asked for a time of the file and we actually got one as well,
         we "emulate" a HTTP-style header in our output. */

      if(data->set.opt_no_body &&
         ftpc->file &&
         data->set.get_filetime &&
         (data->info.filetime >= 0) ) {
        char headerbuf[128];
        int headerbuflen;
        time_t filetime = data->info.filetime;
        struct tm buffer;
        const struct tm *tm = &buffer;

        result = Curl_gmtime(filetime, &buffer);
        if(result)
          return result;

        /* format: "Tue, 15 Nov 1994 12:45:26" */
        headerbuflen = msnprintf(headerbuf, sizeof(headerbuf),
                  "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                  Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
                  tm->tm_mday,
                  Curl_month[tm->tm_mon],
                  tm->tm_year + 1900,
                  tm->tm_hour,
                  tm->tm_min,
                  tm->tm_sec);
        result = Curl_client_write(data, CLIENTWRITE_BOTH, headerbuf,
                                   headerbuflen);
        if(result)
          return result;
      } /* end of a ridiculous amount of conditionals */
#endif
    }
    break;
  default:
    infof(data, "unsupported MDTM reply format");
    break;
  case 550: /* 550 is used for several different problems, e.g.
               "No such file or directory" or "Permission denied".
               It does not mean that the file does not exist at all. */
    infof(data, "MDTM failed: file does not exist or permission problem,"
          " continuing");
    break;
  }

  if(data->set.timecondition) {
    if((data->info.filetime > 0) && (data->set.timevalue > 0)) {
      switch(data->set.timecondition) {
      case CURL_TIMECOND_IFMODSINCE:
      default:
        if(data->info.filetime <= data->set.timevalue) {
          infof(data, "The requested document is not new enough");
          ftp->transfer = PPTRANSFER_NONE; /* mark to not transfer data */
          data->info.timecond = TRUE;
          state(data, FTP_STOP);
          return CURLE_OK;
        }
        break;
      case CURL_TIMECOND_IFUNMODSINCE:
        if(data->info.filetime > data->set.timevalue) {
          infof(data, "The requested document is not old enough");
          ftp->transfer = PPTRANSFER_NONE; /* mark to not transfer data */
          data->info.timecond = TRUE;
          state(data, FTP_STOP);
          return CURLE_OK;
        }
        break;
      } /* switch */
    }
    else {
      infof(data, "Skipping time comparison");
    }
  }

  if(!result)
    result = ftp_state_type(data);

  return result;
}